

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmULT.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int local_1c [2];
  int argc_local;
  
  local_1c[0] = argc;
  testing::InitGoogleTest(local_1c,argv);
  g_argc = local_1c[0];
  g_argv = argv;
  iVar1 = RUN_ALL_TESTS();
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
    int FailCount = 0;

    testing::InitGoogleTest(&argc, argv);

    g_argc = argc;
    g_argv = argv;

    FailCount += RUN_ALL_TESTS();

    return FailCount;
}